

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::CloseGap
          (RepeatedPtrFieldBase *this,int start,int num)

{
  int iVar1;
  Rep *pRVar2;
  long lVar3;
  
  pRVar2 = this->rep_;
  if (pRVar2 != (Rep *)0x0) {
    for (lVar3 = (long)(start + num); iVar1 = pRVar2->allocated_size, lVar3 < iVar1;
        lVar3 = lVar3 + 1) {
      *(void **)((long)pRVar2 + (long)num * -8 + 8 + lVar3 * 8) = pRVar2->elements[lVar3];
      pRVar2 = this->rep_;
    }
    this->current_size_ = this->current_size_ - num;
    pRVar2->allocated_size = iVar1 - num;
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::CloseGap(int start, int num) {
  if (rep_ == nullptr) return;
  // Close up a gap of "num" elements starting at offset "start".
  for (int i = start + num; i < rep_->allocated_size; ++i)
    rep_->elements[i - num] = rep_->elements[i];
  current_size_ -= num;
  rep_->allocated_size -= num;
}